

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O0

void HTS_PStream_conv_gv(HTS_PStream *pst,size_t m)

{
  size_t in_RSI;
  HTS_PStream *in_RDI;
  double dVar1;
  double vari;
  double mean;
  double ratio;
  size_t t;
  double local_30;
  double local_28 [2];
  ulong local_18;
  size_t local_10;
  HTS_PStream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  HTS_PStream_calc_gv(in_RDI,in_RSI,local_28,&local_30);
  dVar1 = sqrt(local_8->gv_mean[local_10] / local_30);
  for (local_18 = 0; local_18 < local_8->length; local_18 = local_18 + 1) {
    if (local_8->gv_switch[local_18] != '\0') {
      local_8->par[local_18][local_10] =
           dVar1 * (local_8->par[local_18][local_10] - local_28[0]) + local_28[0];
    }
  }
  return;
}

Assistant:

static void HTS_PStream_conv_gv(HTS_PStream * pst, size_t m)
{
   size_t t;
   double ratio;
   double mean;
   double vari;

   HTS_PStream_calc_gv(pst, m, &mean, &vari);
   ratio = sqrt(pst->gv_mean[m] / vari);
   for (t = 0; t < pst->length; t++)
      if (pst->gv_switch[t])
         pst->par[t][m] = ratio * (pst->par[t][m] - mean) + mean;
}